

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerGenerator.cc
# Opt level: O0

void __thiscall Field::generateCondition(Field *this,SeparatedListHelper *out)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  ostream *poVar5;
  void *pvVar6;
  uint32_t svalue;
  uint32_t mask;
  SeparatedListHelper *out_local;
  Field *this_local;
  
  if ((this->match & 1U) != 0) {
    iVar1 = this->from;
    iVar2 = this->to;
    uVar3 = this->value;
    iVar4 = this->to;
    poVar5 = SeparatedListHelper::next(out);
    poVar5 = std::operator<<(poVar5,"(insn & 0x");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (pvVar6,(1 << (0x1fU - (char)iVar1 & 0x1f)) * 2 -
                               (1 << (0x20U - (char)iVar2 & 0x1f)));
    poVar5 = std::operator<<(poVar5,") == 0x");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
    std::ostream::operator<<(pvVar6,uVar3 << (0x20U - (char)iVar4 & 0x1f));
  }
  return;
}

Assistant:

void Field::generateCondition(SeparatedListHelper& out)
{
    if(match)
    {
        uint32_t mask = 2*(1 << (31-from)) - (1 << (32-to));
        uint32_t svalue = value << (32-to);
        out.next() << "(insn & 0x" << std::hex << mask << ") == 0x" << std::hex << svalue;
    }
}